

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

void duckdb::ApproximateQuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  FunctionData *vec;
  optional_ptr<duckdb::FunctionData,_true> local_18;
  
  local_18.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_18);
  vec = local_18.ptr + 8;
  (**(code **)(*(long *)serializer + 0x10))(serializer,100,"quantiles");
  Serializer::WriteValue<float>(serializer,(vector<float,_true> *)vec);
  (**(code **)(*(long *)serializer + 0x18))(serializer);
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                      const AggregateFunction &function) {
		auto &bind_data = bind_data_p->Cast<ApproximateQuantileBindData>();
		serializer.WriteProperty(100, "quantiles", bind_data.quantiles);
	}